

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_signed_char_*> *fmt)

{
  char *pcVar1;
  
  std::operator<<(str,"{ ");
  for (pcVar1 = fmt->begin; pcVar1 != fmt->end; pcVar1 = pcVar1 + 1) {
    if (pcVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::operator<<(str,*pcVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}